

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

bool __thiscall mjs::object::has_property(object *this,wstring_view *name)

{
  bool bVar1;
  property_attribute pVar2;
  gc_heap *h;
  object *this_00;
  bool local_29;
  wstring_view *name_local;
  object *this_local;
  
  pVar2 = own_property_attributes(this,name);
  if (pVar2 == invalid) {
    bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool
                      ((gc_heap_ptr_untracked *)&this->prototype_);
    local_29 = false;
    if (bVar1) {
      h = heap(this);
      this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->prototype_,h);
      local_29 = has_property(this_00,name);
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool object::has_property(const std::wstring_view& name) const {
    if (own_property_attributes(name) != property_attribute::invalid) {
        return true;
    }
    return prototype_ && prototype_.dereference(heap()).has_property(name);
}